

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::AtLeastOneGroup,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addMultiArgWithNameOnly<char_const(&)[2]>
          (API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,char (*name) [2],bool isWithValue,bool isRequired,String *desc,String *longDesc,
          String *defaultValue,String *valueSpecifier)

{
  ulong uVar1;
  pointer pMVar2;
  byte in_CL;
  byte in_DL;
  API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  undefined8 in_stack_00000008;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> arg;
  pointer in_stack_ffffffffffffff68;
  Arg *in_stack_ffffffffffffff70;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff78;
  MultiArg *in_stack_ffffffffffffff80;
  ArgPtr *in_stack_ffffffffffffff98;
  GroupIface *in_stack_ffffffffffffffa0;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_58;
  Deleter<Args::ArgIface> local_45 [51];
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  operator_new(0x130);
  MultiArg::MultiArg<char_const(&)[2]>
            (in_stack_ffffffffffffff80,(char (*) [2])in_stack_ffffffffffffff78,
             SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffff70 >> 0x30,0));
  Deleter<Args::ArgIface>::Deleter(local_45,true);
  std::unique_ptr<Args::MultiArg,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x15b592);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x15b5aa);
    Arg::setDescription(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x15b608);
    Arg::setLongDescription(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pMVar2 = std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)
                        0x15b634);
    (*(pMVar2->super_Arg).super_ArgIface._vptr_ArgIface[0x16])(pMVar2,in_stack_00000008);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x15b66a);
    Arg::setValueSpecifier(in_stack_ffffffffffffff70,(String *)in_stack_ffffffffffffff68);
  }
  this_00 = &local_58;
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::MultiArg,Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            (this_00,(unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                     in_stack_ffffffffffffff68);
  GroupIface::addArg(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  return in_RDI;
}

Assistant:

API< PARENT, SELF, ARGPTR, false > & addMultiArgWithNameOnly(
		//! Name for this argument.
		NAME && name,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< MultiArg, details::Deleter< ArgIface > > (
			new MultiArg( std::forward< NAME > ( name ), isWithValue,
				isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}